

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O3

typed_value<std::vector<int,_std::allocator<int>_>,_char> * __thiscall
VW::config::options_boost_po::add_notifier<int>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<int>_> *opt,
          typed_value<std::vector<int,_std::allocator<int>_>,_char> *po_value)

{
  functor_type_conflict1 local_40;
  function1<void,_const_std::vector<int,_std::allocator<int>_>_&> local_28;
  
  local_40.opt.super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (opt->super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_40.opt.super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (opt->super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_40.opt.super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.opt.super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.opt.
            super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.opt.super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.opt.
            super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_40.this = this;
  boost::function1<void,std::vector<int,std::allocator<int>>const&>::
  function1<VW::config::options_boost_po::add_notifier<int>(std::shared_ptr<VW::config::typed_option<int>>&,boost::program_options::typed_value<std::vector<int,std::allocator<int>>,char>*)::_lambda(std::vector<int,std::allocator<int>>)_1_>
            ((function1<void,std::vector<int,std::allocator<int>>const&> *)&local_28,&local_40,0);
  boost::function1<void,_const_std::vector<int,_std::allocator<int>_>_&>::operator=
            (&po_value->m_notifier,&local_28);
  boost::function1<void,_const_std::vector<int,_std::allocator<int>_>_&>::~function1(&local_28);
  if (local_40.opt.super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.opt.
               super___shared_ptr<VW::config::typed_option<int>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return po_value;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::add_notifier(
    std::shared_ptr<typed_option<T>>& opt, po::typed_value<std::vector<T>>* po_value)
{
  return po_value->notifier([this, opt](std::vector<T> final_arguments) {
    T first = final_arguments[0];
    for (auto const& item : final_arguments)
    {
      if (item != first)
      {
        std::stringstream ss;
        ss << "Disagreeing option values for '" << opt->m_name << "': '" << first << "' vs '" << item << "'";
        THROW_EX(VW::vw_argument_disagreement_exception, ss.str());
      }
    }

    // Set the value for the listening location.
    opt->m_location = first;
    opt->value(first);
  });
}